

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O0

void * add_filter_option(pcp_flow_t *f,void *cur)

{
  uint16_t uVar1;
  pcp_filter_option_t *filter_op;
  void *cur_local;
  pcp_flow_t *f_local;
  
  *(undefined1 *)cur = 3;
  *(undefined1 *)((long)cur + 1) = 0;
  uVar1 = htons(0x14);
  *(uint16_t *)((long)cur + 2) = uVar1;
  *(undefined1 *)((long)cur + 4) = 0;
  *(uint8_t *)((long)cur + 5) = f->filter_prefix;
  *(uint16_t *)((long)cur + 6) = f->filter_port;
  *(undefined8 *)((long)cur + 8) = *(undefined8 *)&(f->filter_ip).__in6_u;
  *(undefined8 *)((long)cur + 0x10) = *(undefined8 *)((long)&(f->filter_ip).__in6_u + 8);
  return (void *)((long)cur + 0x18);
}

Assistant:

static void *add_filter_option(pcp_flow_t *f, void *cur) {
    pcp_filter_option_t *filter_op = (pcp_filter_option_t *)cur;

    filter_op->option = PCP_OPTION_FILTER;
    filter_op->reserved = 0;
    filter_op->len =
        htons(sizeof(pcp_filter_option_t) - sizeof(pcp_options_hdr_t));
    filter_op->reserved2 = 0;
    filter_op->filter_prefix = f->filter_prefix;
    filter_op->filter_peer_port = f->filter_port;
    memcpy(&filter_op->filter_peer_ip, &f->filter_ip,
           sizeof(filter_op->filter_peer_ip));
    cur = filter_op->next_data;

    return cur;
}